

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::DataManWriter::~DataManWriter(DataManWriter *this)

{
  DataManWriter *in_RDI;
  
  ~DataManWriter(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

DataManWriter::~DataManWriter()
{
    if (not m_IsClosed)
    {
        DoClose();
    }
}